

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O3

bool __thiscall wasm::StackIROptimizer::isControlFlowBarrier(StackIROptimizer *this,StackInst *inst)

{
  return (bool)((byte)(0x5eb4 >> ((byte)inst->op & 0x1f)) & inst->op < (TryTableEnd|BlockBegin));
}

Assistant:

bool StackIROptimizer::isControlFlowBarrier(StackInst* inst) {
  switch (inst->op) {
    case StackInst::BlockEnd:
    case StackInst::IfElse:
    case StackInst::IfEnd:
    case StackInst::LoopEnd:
    case StackInst::Catch:
    case StackInst::CatchAll:
    case StackInst::Delegate:
    case StackInst::TryEnd:
    case StackInst::TryTableEnd: {
      return true;
    }
    default: {
      return false;
    }
  }
}